

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

LexerState * lexer_OpenFile(char *path)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  int local_cc;
  void *local_c0;
  void *mappingAddr;
  stat fileInfo;
  LexerState *state;
  char *pcStack_18;
  bool isStdin;
  char *path_local;
  
  iVar1 = strcmp(path,"-");
  bVar4 = iVar1 == 0;
  fileInfo.__glibc_reserved[2] = (__syscall_slong_t)malloc(0xb8);
  pcStack_18 = path;
  if (bVar4) {
    pcStack_18 = "<stdin>";
  }
  if ((void *)fileInfo.__glibc_reserved[2] == (void *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    error("Failed to allocate memory for lexer state: %s\n",pcVar3);
    path_local = (char *)0x0;
  }
  else if ((bVar4) || (iVar1 = stat(pcStack_18,(stat *)&mappingAddr), iVar1 == 0)) {
    *(char **)fileInfo.__glibc_reserved[2] = pcStack_18;
    *(undefined1 *)(fileInfo.__glibc_reserved[2] + 0x58) = 1;
    if (bVar4) {
      local_cc = 0;
    }
    else {
      local_cc = open(pcStack_18,0);
    }
    *(int *)(fileInfo.__glibc_reserved[2] + 0x10) = local_cc;
    if (*(int *)(fileInfo.__glibc_reserved[2] + 0x10) < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      error("Failed to open file \"%s\": %s\n",pcStack_18,pcVar3);
      free((void *)fileInfo.__glibc_reserved[2]);
      path_local = (char *)0x0;
    }
    else {
      *(undefined1 *)(fileInfo.__glibc_reserved[2] + 8) = 0;
      if ((!bVar4) && (0 < (long)fileInfo.st_rdev)) {
        local_c0 = mmap((void *)0x0,fileInfo.st_rdev,1,2,
                        *(int *)(fileInfo.__glibc_reserved[2] + 0x10),0);
        if ((local_c0 == (void *)0xffffffffffffffff) &&
           (piVar2 = __errno_location(), *piVar2 == 0x5f)) {
          if ((verbose & 1U) != 0) {
            printf("mmap(%s, MAP_PRIVATE) failed, retrying with MAP_SHARED\n",
                   *(undefined8 *)fileInfo.__glibc_reserved[2]);
          }
          local_c0 = mmap((void *)0x0,fileInfo.st_rdev,1,1,
                          *(int *)(fileInfo.__glibc_reserved[2] + 0x10),0);
        }
        if (local_c0 == (void *)0xffffffffffffffff) {
          *(undefined1 *)(fileInfo.__glibc_reserved[2] + 8) = 0;
        }
        else {
          close(*(int *)(fileInfo.__glibc_reserved[2] + 0x10));
          *(undefined1 *)(fileInfo.__glibc_reserved[2] + 8) = 1;
          *(undefined1 *)(fileInfo.__glibc_reserved[2] + 0x28) = 0;
          *(void **)(fileInfo.__glibc_reserved[2] + 0x10) = local_c0;
          if ((long)fileInfo.st_rdev < 0) {
            __assert_fail("fileInfo.st_size >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                          ,0x1e3,"lexer_OpenFile");
          }
          *(__dev_t *)(fileInfo.__glibc_reserved[2] + 0x18) = fileInfo.st_rdev;
          *(undefined8 *)(fileInfo.__glibc_reserved[2] + 0x20) = 0;
          if ((verbose & 1U) != 0) {
            printf("File %s successfully mmap()ped\n",pcStack_18);
          }
        }
      }
      if ((*(byte *)(fileInfo.__glibc_reserved[2] + 8) & 1) == 0) {
        if ((verbose & 1U) != 0) {
          if (bVar4) {
            printf("Opening stdin\n");
          }
          else if (fileInfo.st_rdev == 0) {
            printf("File %s is empty\n",pcStack_18);
          }
          else {
            piVar2 = __errno_location();
            pcVar3 = strerror(*piVar2);
            printf("File %s opened as regular, errno reports \"%s\"\n",pcStack_18,pcVar3);
          }
        }
        *(undefined8 *)(fileInfo.__glibc_reserved[2] + 0x18) = 0;
        *(undefined8 *)(fileInfo.__glibc_reserved[2] + 0x50) = 0;
      }
      initState((LexerState *)fileInfo.__glibc_reserved[2]);
      *(undefined4 *)(fileInfo.__glibc_reserved[2] + 100) = 0;
      path_local = (char *)fileInfo.__glibc_reserved[2];
    }
  }
  else {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    error("Failed to stat file \"%s\": %s\n",pcStack_18,pcVar3);
    free((void *)fileInfo.__glibc_reserved[2]);
    path_local = (char *)0x0;
  }
  return (LexerState *)path_local;
}

Assistant:

struct LexerState *lexer_OpenFile(char const *path)
{
	bool isStdin = !strcmp(path, "-");
	struct LexerState *state = (struct LexerState *)malloc(sizeof(*state));
	struct stat fileInfo;

	// Give stdin a nicer file name
	if (isStdin)
		path = "<stdin>";
	if (!state) {
		error("Failed to allocate memory for lexer state: %s\n", strerror(errno));
		return NULL;
	}
	if (!isStdin && stat(path, &fileInfo) != 0) {
		error("Failed to stat file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->path = path;
	state->isFile = true;
	state->fd = isStdin ? STDIN_FILENO : open(path, O_RDONLY);
	if (state->fd < 0) {
		error("Failed to open file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->isMmapped = false; // By default, assume it won't be mmap()ed
	if (!isStdin && fileInfo.st_size > 0) {
		// Try using `mmap` for better performance

		// Important: do NOT assign to `state->ptr` directly, to avoid a cast that may
		// alter an eventual `MAP_FAILED` value. It would also invalidate `state->fd`,
		// being on the other side of the union.
		void *mappingAddr;

		mapFile(mappingAddr, state->fd, state->path, fileInfo.st_size);
		if (mappingAddr == MAP_FAILED) {
			// If mmap()ing failed, try again using another method (below)
			state->isMmapped = false;
		} else {
			// IMPORTANT: the `union` mandates this is accessed before other members!
			close(state->fd);

			state->isMmapped = true;
			state->isReferenced = false; // By default, a state isn't referenced
			state->ptr = (char *)mappingAddr;
			assert(fileInfo.st_size >= 0);
			state->size = (size_t)fileInfo.st_size;
			state->offset = 0;

			if (verbose)
				printf("File %s successfully mmap()ped\n", path);
		}
	}
	if (!state->isMmapped) {
		// Sometimes mmap() fails or isn't available, so have a fallback
		if (verbose) {
			if (isStdin)
				printf("Opening stdin\n");
			else if (fileInfo.st_size == 0)
				printf("File %s is empty\n", path);
			else
				printf("File %s opened as regular, errno reports \"%s\"\n",
				       path, strerror(errno));
		}
		state->index = 0;
		state->nbChars = 0;
	}

	initState(state);
	state->lineNo = 0; // Will be incremented at first line start
	return state;
}